

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall SharedPtr_FromPointer_Test::TestBody(SharedPtr_FromPointer_Test *this)

{
  bool bVar1;
  char *pcVar2;
  int *lhs;
  AssertHelper local_e0;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_3;
  Message local_b0;
  int *local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_2;
  Message local_88;
  uint local_7c;
  size_t local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58;
  bool local_4d [20];
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  SharedPtr<int> ptr;
  int *sourcePtr;
  SharedPtr_FromPointer_Test *this_local;
  
  ptr.totalUse = (atomic_uint *)operator_new(4);
  ((ptr.totalUse)->super___atomic_base<unsigned_int>)._M_i = 0x315;
  SharedPtr<int>::SharedPtr((SharedPtr<int> *)&gtest_ar.message_,(int *)ptr.totalUse);
  local_39 = SharedPtr::operator_cast_to_bool((SharedPtr *)&gtest_ar.message_);
  local_4d[0] = true;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_38,"static_cast<bool>(ptr)","true",&local_39,local_4d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OzoNeTT[P]lab-03-shared-ptr/tests/test.cpp"
               ,0xc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_78 = SharedPtr<int>::use_count((SharedPtr<int> *)&gtest_ar.message_);
  local_7c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
            ((EqHelper<false> *)local_70,"ptr.use_count()","1u",&local_78,&local_7c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OzoNeTT[P]lab-03-shared-ptr/tests/test.cpp"
               ,0xd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  local_a8 = SharedPtr<int>::get((SharedPtr<int> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int*,int*>
            ((EqHelper<false> *)local_a0,"ptr.get()","sourcePtr",&local_a8,(int **)&ptr.totalUse);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OzoNeTT[P]lab-03-shared-ptr/tests/test.cpp"
               ,0xe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  lhs = SharedPtr<int>::operator*((SharedPtr<int> *)&gtest_ar.message_);
  local_cc = 0x315;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_c8,"*ptr","789",lhs,&local_cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OzoNeTT[P]lab-03-shared-ptr/tests/test.cpp"
               ,0xf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  SharedPtr<int>::~SharedPtr((SharedPtr<int> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(SharedPtr, FromPointer)
{
    auto sourcePtr = new int{789};
    auto ptr = SharedPtr<int>{sourcePtr};

    EXPECT_EQ(static_cast<bool>(ptr), true);
    EXPECT_EQ(ptr.use_count(), 1u);
    EXPECT_EQ(ptr.get(), sourcePtr);
    EXPECT_EQ(*ptr, 789);
}